

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_file_buffer.h
# Opt level: O0

int __thiscall cppcms::http::impl::file_buffer::pbackfail(file_buffer *this,int param_2)

{
  int iVar1;
  streamoff sVar2;
  char_type *__c;
  long *in_RDI;
  int by;
  fpos local_28 [16];
  int local_18;
  int_type local_4;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    if (in_RDI[0xc] == 0) {
      local_4 = -1;
    }
    else {
      local_18 = 0x200;
      if (in_RDI[0xc] < 0x200) {
        local_18 = (int)in_RDI[0xc];
      }
      local_28 = (fpos  [16])(**(code **)(*in_RDI + 0x20))(in_RDI,(long)-local_18,1,8);
      sVar2 = std::fpos::operator_cast_to_long(local_28);
      if (sVar2 < 0) {
        local_4 = -1;
      }
      else {
        iVar1 = (**(code **)(*in_RDI + 0x48))();
        if (iVar1 < 0) {
          local_4 = -1;
        }
        else {
          std::streambuf::gbump((int)in_RDI);
          __c = (char_type *)std::streambuf::gptr();
          local_4 = std::char_traits<char>::to_int_type(__c);
        }
      }
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int pbackfail(int)
	{
		if(in_memory_)
			return -1;
		if(read_offset_ == 0)
			return -1;

		int by = buffer_size / 2;

		if(read_offset_ < by) 
			by = read_offset_;

		if(seekoff(-by,std::ios_base::cur,std::ios_base::in) < 0)
			return -1;
		if(underflow()  < 0)
			return -1;
		gbump(by - 1);
		return std::char_traits<char>::to_int_type(*gptr());
	}